

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>
::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>,wchar_t>>::int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer>
             *this,back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> *it)

{
  iterator __position;
  back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_> __result;
  long lVar1;
  wchar_t __tmp;
  wchar_t local_2c;
  
  __result = (back_insert_iterator<std::vector<wchar_t,_std::allocator<wchar_t>_>_>)it->container;
  if (*(long *)(this + 0x10) != 0) {
    __result = std::__copy_move<false,false,std::random_access_iterator_tag>::
               __copy_m<char_const*,std::back_insert_iterator<std::vector<wchar_t,std::allocator<wchar_t>>>>
                         (*(char **)(this + 8),*(char **)(this + 8) + *(long *)(this + 0x10),
                          __result);
    it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)__result;
  }
  lVar1 = *(long *)(this + 0x20);
  local_2c = *(wchar_t *)(this + 0x18);
  if (lVar1 != 0) {
    do {
      __position._M_current = *(wchar_t **)((long)__result.container + 8);
      if (__position._M_current == *(wchar_t **)((long)__result.container + 0x10)) {
        std::vector<wchar_t,std::allocator<wchar_t>>::_M_realloc_insert<wchar_t_const&>
                  ((vector<wchar_t,std::allocator<wchar_t>> *)__result.container,__position,
                   &local_2c);
      }
      else {
        *__position._M_current = local_2c;
        *(wchar_t **)((long)__result.container + 8) = __position._M_current + 1;
      }
      lVar1 = lVar1 + -1;
    } while (lVar1 != 0);
  }
  it->container = (vector<wchar_t,_std::allocator<wchar_t>_> *)__result;
  int_writer<unsigned_long_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
            ((num_writer *)(this + 0x28),it);
  return;
}

Assistant:

void operator()(It &&it) const {
      if (prefix.size() != 0)
        it = internal::copy_str<char_type>(prefix.begin(), prefix.end(), it);
      it = std::fill_n(it, padding, fill);
      f(it);
    }